

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryBuffer.cpp
# Opt level: O0

void __thiscall
llvm::SmallVectorMemoryBuffer::~SmallVectorMemoryBuffer(SmallVectorMemoryBuffer *this)

{
  SmallVectorMemoryBuffer *this_local;
  
  (this->super_MemoryBuffer)._vptr_MemoryBuffer =
       (_func_int **)&PTR__SmallVectorMemoryBuffer_030a4a50;
  std::__cxx11::string::~string((string *)&this->BufferName);
  SmallVector<char,_0U>::~SmallVector(&this->SV);
  MemoryBuffer::~MemoryBuffer(&this->super_MemoryBuffer);
  return;
}

Assistant:

SmallVectorMemoryBuffer::~SmallVectorMemoryBuffer() {}